

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureBMP180.cpp
# Opt level: O3

void __thiscall RTPressureBMP180::setTestData(RTPressureBMP180 *this)

{
  this->m_AC1 = 0x198;
  this->m_AC2 = -0x48;
  this->m_AC3 = -0x382f;
  this->m_AC4 = 0x7fe5;
  this->m_AC5 = 0x7ff5;
  this->m_AC6 = 0x5a71;
  this->m_B1 = 0x182e;
  this->m_B2 = 4;
  this->m_MB = -0x7fff;
  this->m_MC = -0x2207;
  this->m_MD = 0xb34;
  this->m_rawPressure = 0x5d23;
  this->m_rawTemperature = 0x6cfa;
  return;
}

Assistant:

void RTPressureBMP180::setTestData()
{
    m_AC1 = 408;
    m_AC2 = -72;
    m_AC3 = -14383;
    m_AC4 = 32741;
    m_AC5 = 32757;
    m_AC6 = 23153;
    m_B1 = 6190;
    m_B2 = 4;
    m_MB = -32767;
    m_MC = -8711;
    m_MD = 2868;

    m_rawTemperature = 27898;
    m_rawPressure = 23843;
}